

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory.cpp
# Opt level: O1

void __thiscall
QSharedMemoryPrivate::setUnixErrorString(QSharedMemoryPrivate *this,QLatin1StringView function)

{
  int iVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  SharedMemoryError SVar5;
  int *piVar6;
  long in_FS_OFFSET;
  QAnyStringView a;
  QAnyStringView a_00;
  QAnyStringView a_01;
  QAnyStringView a_02;
  QString local_78;
  QString local_60;
  QString local_48;
  QLatin1String local_28;
  long local_18;
  
  local_28.m_data = function.m_data;
  local_28.m_size = function.m_size;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  piVar6 = __errno_location();
  iVar1 = *piVar6;
  if (iVar1 < 0x11) {
    if (iVar1 == 2) {
      QMetaObject::tr(&local_60,&QSharedMemory::staticMetaObject,"%1: doesn\'t exist",(char *)0x0,-1
                     );
      a_01.m_size = local_28.m_size | 0x4000000000000000;
      a_01.field_0.m_data = local_28.m_data;
      QString::arg_impl(&local_48,&local_60,a_01,0,(QChar)0x20);
      pQVar2 = &((this->errorString).d.d)->super_QArrayData;
      pcVar3 = (this->errorString).d.ptr;
      (this->errorString).d.d = local_48.d.d;
      (this->errorString).d.ptr = local_48.d.ptr;
      qVar4 = (this->errorString).d.size;
      (this->errorString).d.size = local_48.d.size;
      local_48.d.d = (Data *)pQVar2;
      local_48.d.ptr = pcVar3;
      local_48.d.size = qVar4;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
        }
      }
      SVar5 = NotFound;
      goto LAB_0021c392;
    }
    if (iVar1 == 0xc) {
LAB_0021c031:
      QMetaObject::tr(&local_60,&QSharedMemory::staticMetaObject,"%1: out of resources",(char *)0x0,
                      -1);
      a_00.m_size = local_28.m_size | 0x4000000000000000;
      a_00.field_0.m_data = local_28.m_data;
      QString::arg_impl(&local_48,&local_60,a_00,0,(QChar)0x20);
      pQVar2 = &((this->errorString).d.d)->super_QArrayData;
      pcVar3 = (this->errorString).d.ptr;
      (this->errorString).d.d = local_48.d.d;
      (this->errorString).d.ptr = local_48.d.ptr;
      qVar4 = (this->errorString).d.size;
      (this->errorString).d.size = local_48.d.size;
      local_48.d.d = (Data *)pQVar2;
      local_48.d.ptr = pcVar3;
      local_48.d.size = qVar4;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
        }
      }
      SVar5 = OutOfResources;
      goto LAB_0021c392;
    }
    if (iVar1 == 0xd) {
      QMetaObject::tr(&local_60,&QSharedMemory::staticMetaObject,"%1: permission denied",(char *)0x0
                      ,-1);
      a.m_size = local_28.m_size | 0x4000000000000000;
      a.field_0.m_data = local_28.m_data;
      QString::arg_impl(&local_48,&local_60,a,0,(QChar)0x20);
      pQVar2 = &((this->errorString).d.d)->super_QArrayData;
      pcVar3 = (this->errorString).d.ptr;
      (this->errorString).d.d = local_48.d.d;
      (this->errorString).d.ptr = local_48.d.ptr;
      qVar4 = (this->errorString).d.size;
      (this->errorString).d.size = local_48.d.size;
      local_48.d.d = (Data *)pQVar2;
      local_48.d.ptr = pcVar3;
      local_48.d.size = qVar4;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
        }
      }
      SVar5 = PermissionDenied;
      goto LAB_0021c392;
    }
  }
  else {
    if (iVar1 == 0x11) {
      QMetaObject::tr(&local_60,&QSharedMemory::staticMetaObject,"%1: already exists",(char *)0x0,-1
                     );
      a_02.m_size = local_28.m_size | 0x4000000000000000;
      a_02.field_0.m_data = local_28.m_data;
      QString::arg_impl(&local_48,&local_60,a_02,0,(QChar)0x20);
      pQVar2 = &((this->errorString).d.d)->super_QArrayData;
      pcVar3 = (this->errorString).d.ptr;
      (this->errorString).d.d = local_48.d.d;
      (this->errorString).d.ptr = local_48.d.ptr;
      qVar4 = (this->errorString).d.size;
      (this->errorString).d.size = local_48.d.size;
      local_48.d.d = (Data *)pQVar2;
      local_48.d.ptr = pcVar3;
      local_48.d.size = qVar4;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
        }
      }
      SVar5 = AlreadyExists;
      goto LAB_0021c392;
    }
    if ((iVar1 == 0x18) || (iVar1 == 0x1c)) goto LAB_0021c031;
  }
  QMetaObject::tr(&local_60,&QSharedMemory::staticMetaObject,"%1: unknown error: %2",(char *)0x0,-1)
  ;
  qt_error_string(&local_78,*piVar6);
  QString::arg<QLatin1String&,QString>(&local_48,&local_60,&local_28,&local_78);
  pQVar2 = &((this->errorString).d.d)->super_QArrayData;
  pcVar3 = (this->errorString).d.ptr;
  (this->errorString).d.d = local_48.d.d;
  (this->errorString).d.ptr = local_48.d.ptr;
  qVar4 = (this->errorString).d.size;
  (this->errorString).d.size = local_48.d.size;
  local_48.d.d = (Data *)pQVar2;
  local_48.d.ptr = pcVar3;
  local_48.d.size = qVar4;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  SVar5 = UnknownError;
LAB_0021c392:
  this->error = SVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSharedMemoryPrivate::setUnixErrorString(QLatin1StringView function)
{
    // EINVAL is handled in functions so they can give better error strings
    switch (errno) {
    case EACCES:
        errorString = QSharedMemory::tr("%1: permission denied").arg(function);
        error = QSharedMemory::PermissionDenied;
        break;
    case EEXIST:
        errorString = QSharedMemory::tr("%1: already exists").arg(function);
        error = QSharedMemory::AlreadyExists;
        break;
    case ENOENT:
        errorString = QSharedMemory::tr("%1: doesn't exist").arg(function);
        error = QSharedMemory::NotFound;
        break;
    case EMFILE:
    case ENOMEM:
    case ENOSPC:
        errorString = QSharedMemory::tr("%1: out of resources").arg(function);
        error = QSharedMemory::OutOfResources;
        break;
    default:
        errorString = QSharedMemory::tr("%1: unknown error: %2")
                .arg(function, qt_error_string(errno));
        error = QSharedMemory::UnknownError;
#if defined QSHAREDMEMORY_DEBUG
        qDebug() << errorString << "key" << key << "errno" << errno << EINVAL;
#endif
    }
}